

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O2

bool __thiscall
EthBasePort::ReadBlockNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *rdata,uint nbytes,uchar flags)

{
  ushort node_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  uint extraout_EDX;
  uchar *puVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  allocator<char> local_69;
  int local_68;
  uint local_64;
  quadlet_t *local_60;
  nodeaddr_t local_58;
  string local_50 [32];
  
  local_68 = (int)CONCAT62(in_register_00000032,node);
  if (local_68 != 0x3f) {
    std::__cxx11::string::string<std::allocator<char>>(local_50,"ReadBlock",&local_69);
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  local_64 = nbytes;
  local_60 = rdata;
  local_58 = addr;
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2f])(this);
  if (0 < iVar2) {
    poVar5 = std::operator<<((this->super_BasePort).outStr,"ReadBlock: flushed ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5," packets");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  BasePort::SetGenericBuffer(&this->super_BasePort);
  puVar6 = (this->super_BasePort).GenericBuffer;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  puVar6 = puVar6 + uVar3;
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  this->fw_tl = this->fw_tl + 1 & 0x3f;
  node_00 = (ushort)local_68;
  uVar7 = (ulong)(ushort)local_68;
  (*(this->super_BasePort)._vptr_BasePort[0x31])
            (this,puVar6,(ulong)(iVar2 + 0x14),uVar7,(ulong)flags);
  make_write_header(this,puVar6,extraout_EDX,flags);
  uVar4 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  uVar3 = local_64;
  make_bread_packet(this,(quadlet_t *)(puVar6 + uVar4),node_00,local_58,local_64,(uint)this->fw_tl);
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                    (this,uVar7,puVar6,(ulong)(iVar2 + 0x14),(ulong)(flags >> 7));
  if ((char)iVar2 != '\0') {
    if (this->eth_read_callback != (EthCallbackType)0x0) {
      bVar1 = (*this->eth_read_callback)(this,(uchar)local_68,(this->super_BasePort).outStr);
      if (!bVar1) {
        poVar5 = std::operator<<((this->super_BasePort).outStr,
                                 "ReadBlock: callback aborting (not reading packet)");
        std::endl<char,std::char_traits<char>>(poVar5);
        return false;
      }
    }
    bVar1 = ReceiveResponseNode(this,node_00,local_60,uVar3,this->fw_tl,(nodeid_t *)0x0);
    return bVar1;
  }
  return false;
}

Assistant:

bool EthBasePort::ReadBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *rdata,
                                unsigned int nbytes, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("ReadBlock"))
        return false;

    // Flush before reading
    int numFlushed = PacketFlushAll();
    if (numFlushed > 0)
        outStr << "ReadBlock: flushed " << numFlushed << " packets" << std::endl;

    // Create buffer that is large enough for Firewire packet
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *sendPacket = GenericBuffer+GetWriteQuadAlign();
    unsigned int sendPacketSize = GetPrefixOffset(WR_FW_HEADER)+FW_BREAD_SIZE;

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(sendPacket, sendPacketSize, node, flags);

    // Make control word
    make_write_header(sendPacket, sendPacketSize, flags);

    // Build FireWire packet
    make_bread_packet(reinterpret_cast<quadlet_t *>(sendPacket+GetPrefixOffset(WR_FW_HEADER)), node, addr, nbytes, fw_tl);
    if (!PacketSend(node, sendPacket, sendPacketSize, flags&FW_NODE_ETH_BROADCAST_MASK))
        return false;

    // Invoke callback (if defined) between sending read request
    // and checking for read response. If callback returns false, we
    // skip checking for a received packet.
    if (eth_read_callback && !(*eth_read_callback)(*this, node, outStr)) {
        outStr << "ReadBlock: callback aborting (not reading packet)" << std::endl;
        return false;
    }

    return ReceiveResponseNode(node, rdata, nbytes, fw_tl);
}